

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_getdate.c
# Opt level: O1

void test_archive_getdate(void)

{
  time_t now;
  time_t tVar1;
  time_t tVar2;
  
  now = time((time_t *)0x0);
  tVar1 = __archive_get_date(now,"Jan 1, 1970 UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L')',tVar1,"get_date(now, \"Jan 1, 1970 UTC\")",0,"0",(void *)0x0);
  tVar1 = __archive_get_date(now,"7:12:18-0530 4 May 1983");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'*',tVar1,"get_date(now, \"7:12:18-0530 4 May 1983\")",0x19166d2a,
                      "420900138",(void *)0x0);
  tVar1 = __archive_get_date(now,"2004/01/29 513 mest");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'+',tVar1,"get_date(now, \"2004/01/29 513 mest\")",0x40187a3c,"1075345980",
                      (void *)0x0);
  tVar1 = __archive_get_date(now,"99/02/17 7pm utc");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L',',tVar1,"get_date(now, \"99/02/17 7pm utc\")",0x36cb11b0,"919278000",
                      (void *)0x0);
  tVar1 = __archive_get_date(now,"02/17/99 7:11am est");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'-',tVar1,"get_date(now, \"02/17/99 7:11am est\")",0x36cab1d4,"919253460",
                      (void *)0x0);
  tVar1 = __archive_get_date(now,"now - 2 hours");
  tVar2 = __archive_get_date(now,"2 hours ago");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'/',tVar1,"get_date(now, \"now - 2 hours\")",tVar2,
                      "get_date(now, \"2 hours ago\")",(void *)0x0);
  tVar1 = __archive_get_date(now,"2 hours ago");
  tVar2 = __archive_get_date(now,"+2 hours ago");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'1',tVar1,"get_date(now, \"2 hours ago\")",tVar2,
                      "get_date(now, \"+2 hours ago\")",(void *)0x0);
  tVar1 = __archive_get_date(now,"now - 2 hours");
  tVar2 = __archive_get_date(now,"-2 hours");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'3',tVar1,"get_date(now, \"now - 2 hours\")",tVar2,
                      "get_date(now, \"-2 hours\")",(void *)0x0);
  tVar1 = __archive_get_date(now,"Sun Feb 22 17:38:26 PST 2009");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'6',tVar1,"get_date(now, \"Sun Feb 22 17:38:26 PST 2009\")",0x49a1fe12,
                      "1235353106",(void *)0x0);
  tVar1 = __archive_get_date(0,"tomorrow");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L';',tVar1,"get_date(0, \"tomorrow\")",0x15180,"24 * 60 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0,"yesterday");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'<',tVar1,"get_date(0, \"yesterday\")",-0x15180,"- 24 * 60 * 60",(void *)0x0
                     );
  tVar1 = __archive_get_date(0,"now + 1 hour");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'=',tVar1,"get_date(0, \"now + 1 hour\")",0xe10,"60 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0,"now + 1 hour + 1 minute");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'>',tVar1,"get_date(0, \"now + 1 hour + 1 minute\")",0xe4c,"60 * 60 + 60",
                      (void *)0x0);
  tVar1 = __archive_get_date(0,"Jan 5, 2009 00:00 UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'A',tVar1,"get_date(0, \"Jan 5, 2009 00:00 UTC\")",0x49614d80,"now",
                      (void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"tomorrow");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'B',tVar1,"get_date(now, \"tomorrow\")",0x49629f00,"now + 24 * 60 * 60",
                      (void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"yesterday");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'C',tVar1,"get_date(now, \"yesterday\")",0x495ffc00,"now - 24 * 60 * 60",
                      (void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"now + 1 hour");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'D',tVar1,"get_date(now, \"now + 1 hour\")",0x49615b90,"now + 60 * 60",
                      (void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"now + 1 hour + 1 minute");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'F',tVar1,"get_date(now, \"now + 1 hour + 1 minute\")",0x49615bcc,
                      "now + 60 * 60 + 60",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"tomorrow 5:16am UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'H',tVar1,"get_date(now, \"tomorrow 5:16am UTC\")",0x4962e910,
                      "now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"UTC 5:16am tomorrow");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'J',tVar1,"get_date(now, \"UTC 5:16am tomorrow\")",0x4962e910,
                      "now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"monday UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'M',tVar1,"get_date(now, \"monday UTC\")",0x49614d80,"now",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"sunday UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'N',tVar1,"get_date(now, \"sunday UTC\")",0x49693680,
                      "now + 6 * 24 * 60 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"tuesday UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'O',tVar1,"get_date(now, \"tuesday UTC\")",0x49629f00,"now + 24 * 60 * 60",
                      (void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"UTC next tuesday");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'R',tVar1,"get_date(now, \"UTC next tuesday\")",0x496bd980,
                      "now + 8 * 24 * 60 * 60",(void *)0x0);
  tVar1 = __archive_get_date(0x49614d80,"last tuesday UTC");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_getdate.c"
                      ,L'U',tVar1,"get_date(now, \"last tuesday UTC\")",0x49596480,
                      "now - 6 * 24 * 60 * 60",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_getdate)
{
	time_t now = time(NULL);

	assertEqualInt(get_date(now, "Jan 1, 1970 UTC"), 0);
	assertEqualInt(get_date(now, "7:12:18-0530 4 May 1983"), 420900138);
	assertEqualInt(get_date(now, "2004/01/29 513 mest"), 1075345980);
	assertEqualInt(get_date(now, "99/02/17 7pm utc"), 919278000);
	assertEqualInt(get_date(now, "02/17/99 7:11am est"), 919253460);
	assertEqualInt(get_date(now, "now - 2 hours"),
	    get_date(now, "2 hours ago"));
	assertEqualInt(get_date(now, "2 hours ago"),
	    get_date(now, "+2 hours ago"));
	assertEqualInt(get_date(now, "now - 2 hours"),
	    get_date(now, "-2 hours"));
	/* It's important that we handle ctime() format. */
	assertEqualInt(get_date(now, "Sun Feb 22 17:38:26 PST 2009"),
	    1235353106);
	/* Basic relative offsets. */
	/* If we use the actual current time as the reference, then
	 * these tests break around DST changes, so it's actually
	 * important to use a specific reference time here. */
	assertEqualInt(get_date(0, "tomorrow"), 24 * 60 * 60);
	assertEqualInt(get_date(0, "yesterday"), - 24 * 60 * 60);
	assertEqualInt(get_date(0, "now + 1 hour"), 60 * 60);
	assertEqualInt(get_date(0, "now + 1 hour + 1 minute"), 60 * 60 + 60);
	/* Repeat the above for a different start time. */
	now = 1231113600; /* Jan 5, 2009 00:00 UTC */
	assertEqualInt(get_date(0, "Jan 5, 2009 00:00 UTC"), now);
	assertEqualInt(get_date(now, "tomorrow"), now + 24 * 60 * 60);
	assertEqualInt(get_date(now, "yesterday"), now - 24 * 60 * 60);
	assertEqualInt(get_date(now, "now + 1 hour"), now + 60 * 60);
	assertEqualInt(get_date(now, "now + 1 hour + 1 minute"),
	    now + 60 * 60 + 60);
	assertEqualInt(get_date(now, "tomorrow 5:16am UTC"),
	    now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60);
	assertEqualInt(get_date(now, "UTC 5:16am tomorrow"),
	    now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60);

	/* Jan 5, 2009 was a Monday. */
	assertEqualInt(get_date(now, "monday UTC"), now);
	assertEqualInt(get_date(now, "sunday UTC"), now + 6 * 24 * 60 * 60);
	assertEqualInt(get_date(now, "tuesday UTC"), now + 24 * 60 * 60);
	/* "next tuesday" is one week after "tuesday" */
	assertEqualInt(get_date(now, "UTC next tuesday"),
	    now + 8 * 24 * 60 * 60);
	/* "last tuesday" is one week before "tuesday" */
	assertEqualInt(get_date(now, "last tuesday UTC"),
	    now - 6 * 24 * 60 * 60);
	/* TODO: Lots more tests here. */
}